

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * __thiscall
google::protobuf::Reflection::RepeatedFieldData
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpp_type,
          Descriptor *message_type)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  CppType in_ECX;
  FieldDescriptor *in_RDX;
  Descriptor *in_R8;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  Message *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined7 in_stack_ffffffffffffff90;
  byte bVar5;
  undefined1 in_stack_ffffffffffffff9a;
  FieldType in_stack_ffffffffffffff9b;
  int in_stack_ffffffffffffff9c;
  ExtensionSet *in_stack_ffffffffffffffa0;
  char *local_8;
  
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x40a118);
  bVar5 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (LogLevel_conflict)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe8c);
    bVar5 = 1;
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    internal::LogFinisher::operator=
              ((LogFinisher *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (LogMessage *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  if ((bVar5 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x40a19a);
  }
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x40a1a7);
  bVar1 = false;
  if ((CVar2 != in_ECX) &&
     ((CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x40a1c7), CVar2 != CPPTYPE_ENUM ||
      (in_ECX != CPPTYPE_INT32)))) {
    internal::LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (LogLevel_conflict)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe8c);
    bVar1 = true;
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    internal::LogFinisher::operator=
              ((LogFinisher *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (LogMessage *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  if (bVar1) {
    internal::LogMessage::~LogMessage((LogMessage *)0x40a295);
  }
  if ((in_R8 != (Descriptor *)0x0) &&
     (pDVar4 = FieldDescriptor::message_type
                         ((FieldDescriptor *)
                          CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90)),
     in_R8 != pDVar4)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (LogLevel_conflict)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe8c);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    internal::LogFinisher::operator=
              ((LogFinisher *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (LogMessage *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    internal::LogMessage::~LogMessage((LogMessage *)0x40a33b);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    this_00 = MutableExtensionSet((Reflection *)
                                  CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                                  (Message *)
                                  CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    iVar3 = FieldDescriptor::number(in_RDX);
    FieldDescriptor::type((FieldDescriptor *)CONCAT44(iVar3,in_stack_fffffffffffffea0));
    FieldDescriptor::is_packed((FieldDescriptor *)this_00);
    local_8 = (char *)internal::ExtensionSet::MutableRawRepeatedField
                                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                                 in_stack_ffffffffffffff9b,(bool)in_stack_ffffffffffffff9a,
                                 (FieldDescriptor *)CONCAT17(bVar5,in_stack_ffffffffffffff90));
  }
  else {
    local_8 = MutableRawNonOneof<char>
                        ((Reflection *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
                         ,in_stack_fffffffffffffe98,
                         (FieldDescriptor *)
                         CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  }
  return local_8;
}

Assistant:

void* Reflection::RepeatedFieldData(Message* message,
                                    const FieldDescriptor* field,
                                    FieldDescriptor::CppType cpp_type,
                                    const Descriptor* message_type) const {
  GOOGLE_CHECK(field->is_repeated());
  GOOGLE_CHECK(field->cpp_type() == cpp_type ||
        (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
         cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32).";
  if (message_type != nullptr) {
    GOOGLE_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    return MutableRawNonOneof<char>(message, field);
  }
}